

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_witness_stack_set
              (wally_tx_witness_stack *stack,size_t index,uchar *witness,size_t witness_len)

{
  int iVar1;
  uchar *__dest;
  wally_tx_witness_item *pwVar2;
  
  if (stack == (wally_tx_witness_stack *)0x0) {
    return -2;
  }
  if (stack->items == (wally_tx_witness_item *)0x0 && stack->items_allocation_len == 0) {
    if (stack->num_items != 0) {
      return -2;
    }
  }
  else if ((stack->items != (wally_tx_witness_item *)0x0) != (stack->items_allocation_len != 0)) {
    return -2;
  }
  if (witness == (uchar *)0x0 && witness_len != 0) {
    return -2;
  }
  if (witness_len == 0) {
    __dest = (uchar *)0x0;
LAB_0010ccc2:
    if (stack->num_items <= index) {
      if (stack->items_allocation_len <= index) {
        pwVar2 = (wally_tx_witness_item *)
                 realloc_array(stack->items,stack->items_allocation_len,index + 1,0x10);
        if (pwVar2 == (wally_tx_witness_item *)0x0) {
          clear_and_free(__dest,witness_len);
          goto LAB_0010cd3e;
        }
        clear_and_free(stack->items,stack->num_items << 4);
        stack->items = pwVar2;
        stack->items_allocation_len = index + 1;
      }
      stack->num_items = index + 1;
    }
    clear_and_free(stack->items[index].witness,stack->items[index].witness_len);
    pwVar2 = stack->items;
    pwVar2[index].witness = __dest;
    pwVar2[index].witness_len = witness_len;
    iVar1 = 0;
  }
  else {
    __dest = (uchar *)wally_malloc(witness_len);
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,witness,witness_len);
      goto LAB_0010ccc2;
    }
LAB_0010cd3e:
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

int wally_tx_witness_stack_set(struct wally_tx_witness_stack *stack, size_t index,
                               const unsigned char *witness, size_t witness_len)
{
    unsigned char *new_witness = NULL;

    if (!is_valid_witness_stack(stack) || (!witness && witness_len))
        return WALLY_EINVAL;

    if (!clone_bytes(&new_witness, witness, witness_len))
        return WALLY_ENOMEM;

    if (index >= stack->num_items) {
        if (index >= stack->items_allocation_len) {
            /* Expand the witness array */
            struct wally_tx_witness_item *p;
            p = realloc_array(stack->items, stack->items_allocation_len,
                              index + 1, sizeof(*stack->items));
            if (!p) {
                clear_and_free(new_witness, witness_len);
                return WALLY_ENOMEM;
            }
            clear_and_free(stack->items, stack->num_items * sizeof(*stack->items));
            stack->items = p;
            stack->items_allocation_len = index + 1;
        }
        stack->num_items = index + 1;
    }
    clear_and_free(stack->items[index].witness, stack->items[index].witness_len);
    stack->items[index].witness = new_witness;
    stack->items[index].witness_len = witness_len;
    return WALLY_OK;
}